

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O3

void __thiscall TTD::FileWriter::FlushAndClose(FileWriter *this)

{
  JsTTDStreamHandle pvVar1;
  
  pvVar1 = this->m_hfile;
  if (pvVar1 != (JsTTDStreamHandle)0x0) {
    if (this->m_cursor != 0) {
      WriteBlock(this,this->m_buffer,this->m_cursor);
      this->m_cursor = 0;
      pvVar1 = this->m_hfile;
    }
    (*this->m_pfClose)(pvVar1,false,true);
    this->m_hfile = (JsTTDStreamHandle)0x0;
  }
  if (this->m_buffer != (byte *)0x0) {
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this->m_buffer,0x200000);
    this->m_buffer = (byte *)0x0;
  }
  return;
}

Assistant:

void FileWriter::FlushAndClose()
    {
        if(this->m_hfile != nullptr)
        {
            if(this->m_cursor != 0)
            {
                this->WriteBlock(this->m_buffer, this->m_cursor);
                this->m_cursor = 0;
            }

            this->m_pfClose(this->m_hfile, false, true);
            this->m_hfile = nullptr;
        }

        if(this->m_buffer != nullptr)
        {
            TT_HEAP_FREE_ARRAY(byte, this->m_buffer, TTD_SERIALIZATION_BUFFER_SIZE);
            this->m_buffer = nullptr;
        }
    }